

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnForward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *F,
          DecomposeType dec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  void *pvVar5;
  int64_t iVar6;
  complex<float> *pcVar7;
  int in_EDX;
  TPZFMatrix<std::complex<float>_> *in_RSI;
  TPZEqnArray<std::complex<float>_> *in_RDI;
  int i_1;
  complex<float> udiag_1;
  int last_term_1;
  int index_1;
  int i;
  complex<float> udiag;
  int last_term;
  int index;
  int j;
  size_t in_stack_00000358;
  char *in_stack_00000360;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff38;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff48;
  complex<float> *in_stack_ffffffffffffff50;
  complex<float> *in_stack_ffffffffffffff58;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff60;
  int local_58;
  int local_4c;
  complex<float> local_48;
  int local_40;
  int local_34;
  _ComplexT local_30;
  int local_28;
  complex<float> local_24;
  int local_1c;
  int local_18;
  int local_14;
  TPZFMatrix<std::complex<float>_> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar2 = IsSymmetric(in_RDI);
  if (iVar2 == 1) {
    for (local_18 = 0; local_18 < in_RDI->fNumEq; local_18 = local_18 + 1) {
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      local_1c = *piVar3;
      TPZVec<std::complex<float>_>::operator[]
                ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_1c);
      std::complex<float>::complex(&local_24,0.0,0.0);
      bVar1 = std::operator==(in_stack_ffffffffffffff50,(complex<float> *)in_stack_ffffffffffffff48)
      ;
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
        poVar4 = std::operator<<(poVar4," Equation = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_18);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_00000360,in_stack_00000358);
      }
      if (local_18 == in_RDI->fNumEq + -1) {
        iVar6 = TPZVec<std::complex<float>_>::NElements
                          ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues);
        local_28 = (int)iVar6;
      }
      else {
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
        local_28 = *piVar3;
      }
      if ((local_14 == 3) || (local_14 == 1)) {
        TPZVec<std::complex<float>_>::operator[]
                  ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_1c);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
                   (int64_t)in_stack_ffffffffffffff50);
        std::complex<float>::operator/=
                  ((complex<float> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
      pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                         (in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
                          (int64_t)in_stack_ffffffffffffff50);
      local_30 = pcVar7->_M_value;
      local_34 = local_1c;
      while (local_34 = local_34 + 1, local_34 < local_28) {
        TPZVec<std::complex<float>_>::operator[]
                  ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_34);
        std::operator*((complex<float> *)in_stack_ffffffffffffff38,(complex<float> *)0x1d6a73b);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_34);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
                   (int64_t)in_stack_ffffffffffffff50);
        std::complex<float>::operator-=
                  (in_stack_ffffffffffffff50,(complex<float> *)in_stack_ffffffffffffff48);
      }
      if (local_14 == 4) {
        TPZVec<std::complex<float>_>::operator[]
                  ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_1c);
        in_stack_ffffffffffffff60 = local_10;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
                   (int64_t)in_stack_ffffffffffffff50);
        std::complex<float>::operator/=
                  ((complex<float> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
  }
  else {
    iVar2 = IsSymmetric(in_RDI);
    if (iVar2 == 2) {
      for (local_18 = 1; local_18 < in_RDI->fNumEq; local_18 = local_18 + 2) {
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        local_40 = *piVar3;
        pcVar7 = TPZVec<std::complex<float>_>::operator[]
                           ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_40);
        std::complex<float>::complex(&local_48,0.0,0.0);
        bVar1 = std::operator==(in_stack_ffffffffffffff50,
                                (complex<float> *)in_stack_ffffffffffffff48);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "Diagonal Value = 0 >> Aborting on Index = ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40);
          poVar4 = std::operator<<(poVar4," Equation = ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,local_18);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          pzinternal::DebugStopImpl(in_stack_00000360,in_stack_00000358);
        }
        if (local_18 == in_RDI->fNumEq + -1) {
          iVar6 = TPZVec<std::complex<float>_>::NElements
                            ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues);
          local_4c = (int)iVar6;
        }
        else {
          piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
          local_4c = *piVar3;
        }
        if ((local_14 == 3) || (local_14 == 1)) {
          in_stack_ffffffffffffff50 =
               TPZVec<std::complex<float>_>::operator[]
                         ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_40);
          in_stack_ffffffffffffff48 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_40);
          TPZFMatrix<std::complex<float>_>::operator()
                    (in_stack_ffffffffffffff60,(int64_t)pcVar7,(int64_t)in_stack_ffffffffffffff50);
          std::complex<float>::operator/=((complex<float> *)in_stack_ffffffffffffff60,pcVar7);
        }
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_40);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff60,(int64_t)pcVar7,(int64_t)in_stack_ffffffffffffff50);
        local_58 = local_40;
        while (local_58 = local_58 + 1, local_58 < local_4c) {
          TPZVec<std::complex<float>_>::operator[]
                    ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_58);
          std::operator*((complex<float> *)in_stack_ffffffffffffff38,(complex<float> *)0x1d6aa63);
          in_stack_ffffffffffffff38 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_58);
          TPZFMatrix<std::complex<float>_>::operator()
                    (in_stack_ffffffffffffff60,(int64_t)pcVar7,(int64_t)in_stack_ffffffffffffff50);
          std::complex<float>::operator-=
                    (in_stack_ffffffffffffff50,(complex<float> *)in_stack_ffffffffffffff48);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}